

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.c
# Opt level: O1

natwm_error client_update_hints(natwm_state *state,client *client,client_hints hints)

{
  uint16_t uVar1;
  natwm_error nVar2;
  workspace *pwVar3;
  
  if (client == (client *)0x0) {
    nVar2 = INVALID_INPUT_ERROR;
  }
  else {
    if ((hints & FRAME_EXTENTS) != 0) {
      uVar1 = client_get_active_border_width(state->workspace_list->theme,client);
      ewmh_update_window_frame_extents(state,client->window,(uint)uVar1);
    }
    if ((hints & WM_DESKTOP) != 0) {
      pwVar3 = workspace_list_find_client_workspace(state->workspace_list,client);
      if (pwVar3 == (workspace *)0x0) {
        internal_logger(natwm_logger,LEVEL_INFO,"Failed to find current desktop");
        return RESOLUTION_FAILURE;
      }
      ewmh_update_window_desktop(state,client->window,pwVar3->index);
    }
    nVar2 = NO_ERROR;
  }
  return nVar2;
}

Assistant:

enum natwm_error client_update_hints(const struct natwm_state *state, const struct client *client,
                                     enum client_hints hints)
{
        if (!client) {
                return INVALID_INPUT_ERROR;
        }

        if (hints & FRAME_EXTENTS) {
                struct theme *theme = state->workspace_list->theme;
                uint32_t border_width = client_get_active_border_width(theme, client);

                ewmh_update_window_frame_extents(state, client->window, border_width);
        }

        if (hints & WM_DESKTOP) {
                struct workspace *workspace
                        = workspace_list_find_client_workspace(state->workspace_list, client);

                if (workspace == NULL) {
                        LOG_INFO(natwm_logger, "Failed to find current desktop");

                        return RESOLUTION_FAILURE;
                }

                ewmh_update_window_desktop(state, client->window, workspace->index);
        }

        return NO_ERROR;
}